

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O3

void __thiscall pg::PPSolver::PPSolver(PPSolver *this,Oink *oink,Game *game)

{
  ulong uVar1;
  uint64_t *__s;
  uint *puVar2;
  ulong uVar3;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PPSolver_001a7620;
  uVar1 = game->n_vertices;
  (this->Z)._size = uVar1;
  uVar3 = uVar1 + 0x3f >> 6;
  (this->Z)._bitssize = uVar3;
  uVar3 = uVar3 << 3;
  (this->Z)._allocsize = uVar3;
  __s = (uint64_t *)operator_new__(uVar3);
  (this->Z)._bits = __s;
  if (0x3f < uVar1 + 0x3f) {
    memset(__s,0,uVar3);
  }
  (this->Q).pointer = 0;
  puVar2 = (uint *)operator_new__((uVar1 & 0xffffffff) << 2);
  (this->Q).queue = puVar2;
  return;
}

Assistant:

PPSolver::PPSolver(Oink& oink, Game& game) : Solver(oink, game), Z(game.nodecount()), Q(game.nodecount())
{
}